

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lighting.cpp
# Opt level: O0

shared_ptr<Lighting> Lighting::Create(shared_ptr<EnvironmentMap> *environment_map)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<Lighting> sVar2;
  shared_ptr<Lighting> *ret;
  element_type *this;
  vec<3,_float,_(glm::qualifier)0> local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::make_shared<Lighting>();
  std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x183fa8);
  std::shared_ptr<EnvironmentMap>::operator=
            ((shared_ptr<EnvironmentMap> *)this,(shared_ptr<EnvironmentMap> *)in_RDI);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_20,5.0);
  peVar1 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x183fd7);
  (peVar1->m_sun_radiance).field_0 = local_20.field_0;
  (peVar1->m_sun_radiance).field_1 = local_20.field_1;
  (peVar1->m_sun_radiance).field_2 = local_20.field_2;
  sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Lighting>)sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Lighting> Lighting::Create(const std::shared_ptr<EnvironmentMap> &environment_map) {
	std::shared_ptr<Lighting> ret = std::make_shared<Lighting>();
	ret->m_environment_map_ptr = environment_map;
	ret->m_sun_radiance = glm::vec3(kDefaultConstantColor);

	return ret;
}